

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accelinstance.h
# Opt level: O3

void __thiscall embree::AccelInstance::build(AccelInstance *this)

{
  Builder *pBVar1;
  AccelData *pAVar2;
  undefined8 uVar3;
  
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<embree::Builder,_std::default_delete<embree::Builder>_>._M_t.
           super__Tuple_impl<0UL,_embree::Builder_*,_std::default_delete<embree::Builder>_>.
           super__Head_base<0UL,_embree::Builder_*,_false>._M_head_impl;
  if (pBVar1 != (Builder *)0x0) {
    (**(code **)((long)(pBVar1->super_RefCount)._vptr_RefCount + 0x20))();
  }
  pAVar2 = (this->accel)._M_t.
           super___uniq_ptr_impl<embree::AccelData,_std::default_delete<embree::AccelData>_>._M_t.
           super__Tuple_impl<0UL,_embree::AccelData_*,_std::default_delete<embree::AccelData>_>.
           super__Head_base<0UL,_embree::AccelData_*,_false>._M_head_impl;
  uVar3 = *(undefined8 *)((long)&(pAVar2->bounds).bounds0 + 8);
  *(undefined8 *)&(this->super_Accel).super_AccelData.bounds.bounds0.lower.field_0 =
       *(undefined8 *)&(pAVar2->bounds).bounds0.lower;
  *(undefined8 *)((long)&(this->super_Accel).super_AccelData.bounds.bounds0.lower.field_0 + 8) =
       uVar3;
  uVar3 = *(undefined8 *)((long)&(pAVar2->bounds).bounds0 + 0x18);
  *(undefined8 *)&(this->super_Accel).super_AccelData.bounds.bounds0.upper.field_0 =
       *(undefined8 *)&((Vec3fa *)((long)&(pAVar2->bounds).bounds0 + 0x10))->field_0;
  *(undefined8 *)((long)&(this->super_Accel).super_AccelData.bounds.bounds0.upper.field_0 + 8) =
       uVar3;
  uVar3 = *(undefined8 *)((long)&(pAVar2->bounds).bounds1 + 8);
  *(undefined8 *)&(this->super_Accel).super_AccelData.bounds.bounds1.lower.field_0 =
       *(undefined8 *)&(pAVar2->bounds).bounds1.lower.field_0;
  *(undefined8 *)((long)&(this->super_Accel).super_AccelData.bounds.bounds1.lower.field_0 + 8) =
       uVar3;
  uVar3 = *(undefined8 *)((long)&(pAVar2->bounds).bounds1 + 0x18);
  *(undefined8 *)&(this->super_Accel).super_AccelData.bounds.bounds1.upper.field_0 =
       *(undefined8 *)&((Vec3fa *)((long)&(pAVar2->bounds).bounds1 + 0x10))->field_0;
  *(undefined8 *)((long)&(this->super_Accel).super_AccelData.bounds.bounds1.upper.field_0 + 8) =
       uVar3;
  return;
}

Assistant:

void build () {
      if (builder) builder->build();
      bounds = accel->bounds;
    }